

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTail.cpp
# Opt level: O0

void __thiscall liblogger::LogTail::Log(LogTail *this,LogType Type,string *str)

{
  size_type sVar1;
  long in_RDI;
  LogManagerScopedLock lock;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  value_type *in_stack_ffffffffffffffd8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  LogManagerScopedLock::LogManagerScopedLock((LogManagerScopedLock *)in_stack_ffffffffffffffd0);
  sVar1 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_stack_ffffffffffffffd0);
  if (*(ulong *)(in_RDI + 8) <= sVar1) {
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(in_stack_ffffffffffffffd0);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  LogManagerScopedLock::~LogManagerScopedLock((LogManagerScopedLock *)0x1a91d7);
  return;
}

Assistant:

void LogTail::Log(const LogType Type, const std::string &str) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	if (m_data.size() >= m_length)
		m_data.pop_front();
	m_data.push_back(str);
}